

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O2

char * MOJOSHADER_glBestProfile
                 (MOJOSHADER_glGetProcAddress gpa,void *lookup_d,MOJOSHADER_malloc m,
                 MOJOSHADER_free f,void *malloc_d)

{
  int iVar1;
  char *prof [6];
  
  iVar1 = MOJOSHADER_glAvailableProfiles(gpa,lookup_d,prof,6,m,f,malloc_d);
  if (iVar1 < 1) {
    set_error("no profiles available");
    prof[0] = (char *)0x0;
  }
  return prof[0];
}

Assistant:

const char *MOJOSHADER_glBestProfile(MOJOSHADER_glGetProcAddress gpa,
                                     void *lookup_d,
                                     MOJOSHADER_malloc m, MOJOSHADER_free f,
                                     void *malloc_d)
{
    const char *prof[STATICARRAYLEN(profile_priorities)];
    const int avail = MOJOSHADER_glAvailableProfiles(gpa, lookup_d, prof,
                                                     STATICARRAYLEN(prof),
                                                     m, f, malloc_d);
    if (avail <= 0)
    {
        set_error("no profiles available");
        return NULL;
    } // if

    return prof[0];  // profiles are sorted "best" to "worst."
}